

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O2

void ZSTD_seqToCodes(seqStore_t *seqStorePtr)

{
  ushort uVar1;
  seqDef *psVar2;
  seqDef *psVar3;
  BYTE *pBVar4;
  BYTE *pBVar5;
  BYTE *pBVar6;
  int iVar7;
  U32 UVar8;
  BYTE BVar9;
  ulong uVar10;
  
  psVar2 = seqStorePtr->sequencesStart;
  psVar3 = seqStorePtr->sequences;
  pBVar4 = seqStorePtr->llCode;
  pBVar5 = seqStorePtr->ofCode;
  pBVar6 = seqStorePtr->mlCode;
  for (uVar10 = 0; ((ulong)((long)psVar3 - (long)psVar2) >> 3 & 0xffffffff) != uVar10;
      uVar10 = uVar10 + 1) {
    uVar1 = psVar2[uVar10].litLength;
    if (uVar1 < 0x40) {
      BVar9 = ZSTD_LLcode_LL_Code[(uint)uVar1];
    }
    else {
      iVar7 = 0x1f;
      if (uVar1 != 0) {
        for (; uVar1 >> iVar7 == 0; iVar7 = iVar7 + -1) {
        }
      }
      BVar9 = '2' - ((byte)iVar7 ^ 0x1f);
    }
    uVar1 = psVar2[uVar10].matchLength;
    pBVar4[uVar10] = BVar9;
    iVar7 = 0x1f;
    if (psVar2[uVar10].offset != 0) {
      for (; psVar2[uVar10].offset >> iVar7 == 0; iVar7 = iVar7 + -1) {
      }
    }
    pBVar5[uVar10] = (BYTE)iVar7;
    if (uVar1 < 0x80) {
      BVar9 = ZSTD_MLcode_ML_Code[(uint)uVar1];
    }
    else {
      iVar7 = 0x1f;
      if (uVar1 != 0) {
        for (; uVar1 >> iVar7 == 0; iVar7 = iVar7 + -1) {
        }
      }
      BVar9 = 'C' - ((byte)iVar7 ^ 0x1f);
    }
    pBVar6[uVar10] = BVar9;
  }
  UVar8 = seqStorePtr->longLengthID;
  if (UVar8 == 1) {
    pBVar4[seqStorePtr->longLengthPos] = '#';
    UVar8 = seqStorePtr->longLengthID;
  }
  if (UVar8 == 2) {
    pBVar6[seqStorePtr->longLengthPos] = '4';
  }
  return;
}

Assistant:

void ZSTD_seqToCodes(const seqStore_t* seqStorePtr)
{
    const seqDef* const sequences = seqStorePtr->sequencesStart;
    BYTE* const llCodeTable = seqStorePtr->llCode;
    BYTE* const ofCodeTable = seqStorePtr->ofCode;
    BYTE* const mlCodeTable = seqStorePtr->mlCode;
    U32 const nbSeq = (U32)(seqStorePtr->sequences - seqStorePtr->sequencesStart);
    U32 u;
    for (u=0; u<nbSeq; u++) {
        U32 const llv = sequences[u].litLength;
        U32 const mlv = sequences[u].matchLength;
        llCodeTable[u] = (BYTE)ZSTD_LLcode(llv);
        ofCodeTable[u] = (BYTE)ZSTD_highbit32(sequences[u].offset);
        mlCodeTable[u] = (BYTE)ZSTD_MLcode(mlv);
    }
    if (seqStorePtr->longLengthID==1)
        llCodeTable[seqStorePtr->longLengthPos] = MaxLL;
    if (seqStorePtr->longLengthID==2)
        mlCodeTable[seqStorePtr->longLengthPos] = MaxML;
}